

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O2

int __thiscall ServerManager::think(ServerManager *this)

{
  int iVar1;
  iterator __position;
  
  __position._M_current =
       (this->m_servers).
       super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while (__position._M_current !=
         (this->m_servers).
         super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = (*(code *)**(undefined8 **)
                        ((__position._M_current)->_M_t).
                        super___uniq_ptr_impl<IRC_Bot,_std::default_delete<IRC_Bot>_>._M_t.
                        super__Tuple_impl<0UL,_IRC_Bot_*,_std::default_delete<IRC_Bot>_>.
                        super__Head_base<0UL,_IRC_Bot_*,_false>._M_head_impl)();
    if (iVar1 == 0) {
      __position._M_current = __position._M_current + 1;
    }
    else {
      __position = std::
                   vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
                   ::erase(&this->m_servers,(const_iterator)__position._M_current);
    }
  }
  return (int)(__position._M_current !=
              (this->m_servers).
              super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start);
}

Assistant:

int ServerManager::think() {
	for (auto itr = m_servers.begin(); itr != m_servers.end();) {
		if ((*itr)->think() != 0) {
			itr = m_servers.erase(itr);
			continue;
		}
		++itr;
	}

	return m_servers.size() != 0;
}